

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O1

string * __thiscall
GrcManager::ProcessClassList_abi_cxx11_
          (string *__return_storage_ptr__,GrcManager *this,RefAST *ast,RefAST *pastNext)

{
  GrcSymbolTable *this_00;
  pointer pcVar1;
  int iVar2;
  uint uVar3;
  Symbol this_01;
  GdlGlyphClassDefn *pglfc;
  RefAST astGlyph;
  undefined1 local_a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string *local_78;
  RefCount<AST> local_70;
  RefCount<AST> local_68;
  RefAST local_60;
  RefAST *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar2 = AST::getType(ast->ref->ptr);
  if (iVar2 == 0xd) {
    AST::getNextSibling(ast->ref->ptr);
    RefCount<AST>::operator=(pastNext,(RefCount<AST> *)local_a0);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_a0);
    if ((pastNext->ref == (Ref *)0x0) || (pastNext->ref->ptr == (AST *)0x0)) {
      AST::getText_abi_cxx11_(__return_storage_ptr__,ast->ref->ptr);
      return __return_storage_ptr__;
    }
    AST::getNextSibling(ast->ref->ptr);
    uVar3 = AST::getType(*(AST **)local_a0._0_8_);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_a0);
    if ((0x1f < uVar3) || ((0xf4002000U >> (uVar3 & 0x1f) & 1) == 0)) {
      AST::getText_abi_cxx11_((string *)local_a0,ast->ref->ptr);
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,(char *)local_a0._0_8_,(allocator *)&local_70);
      if ((Ref *)local_a0._0_8_ != (Ref *)(local_a0 + 0x10)) {
        operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
      }
      if (0x1f < uVar3) {
        return __return_storage_ptr__;
      }
      if ((0xf4002000U >> (uVar3 & 0x1f) & 1) == 0) {
        return __return_storage_ptr__;
      }
    }
  }
  this_00 = this->m_psymtbl;
  local_60 = (RefAST)ast->ref;
  if (local_60.ref == (Ref *)0x0) {
    local_60.ref = (Ref *)0x0;
  }
  else {
    (local_60.ref)->count = (local_60.ref)->count + 1;
  }
  LineAndFile((GrpLineAndFile *)local_a0,this,&local_60);
  this_01 = GrcSymbolTable::AddAnonymousClassSymbol(this_00,(GrpLineAndFile *)local_a0);
  local_58 = pastNext;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._8_8_ != &local_88) {
    operator_delete((void *)local_a0._8_8_,local_88._0_8_ + 1);
  }
  RefCount<AST>::~RefCount(&local_60);
  local_78 = __return_storage_ptr__;
  GrcSymbolTableEntry::FullName_abi_cxx11_(__return_storage_ptr__,this_01);
  pglfc = GrcSymbolTableEntry::GlyphClassDefnData(this_01);
  pcVar1 = (local_78->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + local_78->_M_string_length);
  std::__cxx11::string::_M_assign((string *)&pglfc->m_staName);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  GdlRenderer::AddGlyphClass(this->m_prndr,pglfc);
  local_a0._0_8_ = ast->ref;
  if ((Ref *)local_a0._0_8_ == (Ref *)0x0) {
    local_a0._0_8_ = (Ref *)0x0;
  }
  else {
    ((Ref *)local_a0._0_8_)->count = ((Ref *)local_a0._0_8_)->count + 1;
  }
  if ((Ref *)local_a0._0_8_ != (Ref *)0x0) {
    do {
      if ((*(long *)local_a0._0_8_ == 0) ||
         (((uVar3 = AST::getType(*(AST **)local_a0._0_8_), 0x1f < uVar3 ||
           ((0xf4002000U >> (uVar3 & 0x1f) & 1) == 0)) && (uVar3 != 0x65)))) break;
      if ((Ref *)local_a0._0_8_ == (Ref *)0x0) {
        local_68.ref = (Ref *)0x0;
      }
      else {
        *(uint *)(local_a0._0_8_ + 8) = *(uint *)(local_a0._0_8_ + 8) + 1;
        local_68.ref = (Ref *)local_a0._0_8_;
      }
      ProcessGlyphClassMember(this,&local_68,pglfc,kglfctUnion,(GdlGlyphDefn **)0x0);
      RefCount<AST>::~RefCount(&local_68);
      AST::getNextSibling(*(AST **)local_a0._0_8_);
      RefCount<AST>::operator=((RefCount<AST> *)local_a0,&local_70);
      RefCount<AST>::~RefCount(&local_70);
    } while ((Ref *)local_a0._0_8_ != (Ref *)0x0);
  }
  RefCount<AST>::operator=(local_58,(RefCount<AST> *)local_a0);
  RefCount<AST>::~RefCount((RefCount<AST> *)local_a0);
  return local_78;
}

Assistant:

std::string GrcManager::ProcessClassList(RefAST ast, RefAST * pastNext)
{
	if (ast->getType() == IDENT)
	{
		*pastNext = ast->getNextSibling();
		//	If only one class in the list, just return its name.
		if (!*pastNext)
			return ast->getText();
		int nextNodeTyp = ast->getNextSibling()->getType();
		if (nextNodeTyp != IDENT && nextNodeTyp != LITERAL_glyphid &&
			nextNodeTyp != LITERAL_unicode && nextNodeTyp != LITERAL_codepoint &&
			nextNodeTyp != LITERAL_postscript && nextNodeTyp != LITERAL_pseudo)
		{
			return ast->getText().c_str();
		}
	}

	Symbol psymClass = SymbolTable()->AddAnonymousClassSymbol(LineAndFile(ast));

	std::string staClassName = psymClass->FullName();
	GdlGlyphClassDefn * pglfc = psymClass->GlyphClassDefnData();
	Assert(pglfc);
	pglfc->SetName(staClassName);
	m_prndr->AddGlyphClass(pglfc);

	int nodetyp;
	RefAST astGlyph = ast;
	while (astGlyph &&
		((nodetyp = astGlyph->getType()) == IDENT ||
			nodetyp == LITERAL_glyphid ||
			nodetyp == LITERAL_unicode || nodetyp == LITERAL_codepoint || nodetyp == ZuHex ||
			nodetyp == LITERAL_postscript || nodetyp == LITERAL_pseudo))
	{
		ProcessGlyphClassMember(astGlyph, pglfc, kglfctUnion, NULL);
		astGlyph = astGlyph->getNextSibling();
	}
	*pastNext = astGlyph;

	return staClassName;
}